

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O0

Sum_t * __thiscall Potassco::RuleBuilder::sum(RuleBuilder *this)

{
  Weight_t WVar1;
  MemoryRegion *in_RSI;
  Sum_t *in_RDI;
  Span<Potassco::WeightLit_t> SVar2;
  Sum_t *r;
  Span *in_stack_ffffffffffffffd8;
  Sum_t *this_00;
  
  this_00 = in_RDI;
  rule_((RuleBuilder *)0x265292);
  SVar2 = anon_unknown_20::span_cast<Potassco::WeightLit_t>(in_RSI,in_stack_ffffffffffffffd8);
  (in_RDI->lits).first = SVar2.first;
  (in_RDI->lits).size = SVar2.size;
  WVar1 = bound((RuleBuilder *)this_00);
  in_RDI->bound = WVar1;
  return this_00;
}

Assistant:

Sum_t        RuleBuilder::sum()        const { Sum_t r = {span_cast<WeightLit_t>(mem_, rule_()->body), bound()}; return r; }